

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall gl3cts::TransformFeedback::DrawXFBStream::check(DrawXFBStream *this)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  float *pfVar3;
  ulong uVar4;
  value_type_conflict2 *__val;
  bool bVar5;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  pfVar3 = (float *)operator_new(0x10);
  pfVar3[0] = 0.0;
  pfVar3[1] = 0.0;
  pfVar3[2] = 0.0;
  pfVar3[3] = 0.0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))(0,0,2,2,0x1903,0x1406,pfVar3);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x161a);
  if (ABS(*pfVar3 + -1.0) <= 0.0625) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 3) break;
      uVar1 = uVar4 + 1;
    } while (ABS(pfVar3[uVar4 + 1] + -1.0) <= 0.0625);
    bVar5 = 2 < uVar4;
  }
  else {
    bVar5 = false;
  }
  operator_delete(pfVar3,0x10);
  return bVar5;
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFBStream::check()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(number_of_pixels);

	gl.readPixels(0, 0, s_view_size, s_view_size, GL_RED, GL_FLOAT, &pixels[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if (fabs(pixels[i] - 1.f) > 0.0625 /* precision, expected result == 1.0 */)
		{
			return false;
		}
	}

	return true;
}